

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

string * AssignIterator(string *__return_storage_ptr__,string *FileName)

{
  _Ios_Openmode _Var1;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  undefined1 local_268 [12];
  undefined1 local_258 [12];
  fpos local_248 [39];
  undefined1 local_221;
  istream_type local_220 [8];
  ifstream ResultReader;
  string *FileName_local;
  string *Results;
  
  _Var1 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_220,(string *)FileName,_Var1);
  local_221 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::istream::seekg((long)local_220,_S_beg);
  local_248._0_16_ = std::istream::tellg();
  std::fpos::operator_cast_to_long(local_248);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::istream::seekg((long)local_220,_S_beg);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_258,local_220);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_268);
  __first._12_4_ = 0;
  __first._M_sbuf = (streambuf_type *)local_258._0_8_;
  __first._M_c = local_258._8_4_;
  __last._12_4_ = 0;
  __last._M_sbuf = (streambuf_type *)local_268._0_8_;
  __last._M_c = local_268._8_4_;
  std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__first,__last);
  std::ifstream::close();
  local_221 = 1;
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string AssignIterator(std::string FileName)
{
    std::ifstream ResultReader(FileName, std::ios::in | std::ios::binary);
    std::string Results;
    ResultReader.seekg(0, std::ios::end);
    Results.reserve(ResultReader.tellg());
    ResultReader.seekg(0, std::ios::beg);
    Results.assign((std::istreambuf_iterator<char>(ResultReader)), std::istreambuf_iterator<char>());
    ResultReader.close();
    return(Results);
}